

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O2

void __thiscall
DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
RemoveElement<Memory::NoThrowHeapAllocator>
          (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
           *this,NoThrowHeapAllocator *allocator,
          PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *element)

{
  DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *pDVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  DListNode<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *obj;
  
  obj = (DListNode<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *)
        (element[-1].decommitPages.data + 4);
  bVar3 = HasNode(this,(NodeBase *)obj);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x175,"(HasNode(node))","HasNode(node)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pDVar1 = (obj->
           super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).
           next.base;
  **(long **)&element[-1].freePageCount = (long)pDVar1;
  pDVar1->prev = *(anon_union_8_3_7fb8a913_for_prev *)&element[-1].freePageCount;
  Memory::
  DeleteObject<Memory::NoThrowHeapAllocator,(Memory::AllocatorDeleteFlags)0,DListNode<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>>>
            (allocator,obj);
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void RemoveElement(TAllocator * allocator, TData * element)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, node);

        this->DecrementCount();

    }